

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

usize __thiscall Console::Prompt::Private::readBufferedUtf8Char(Private *this,char *buffer)

{
  byte ch_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ssize_t sVar4;
  byte *pbVar5;
  usize uVar6;
  byte *pbVar7;
  usize result;
  Buffer incompleteUtf8;
  usize len;
  char *start;
  byte *pbStack_20;
  char ch;
  char *buffer_local;
  Private *this_local;
  
  pbStack_20 = (byte *)buffer;
  buffer_local = &this->valid;
  bVar2 = Buffer::isEmpty(&this->bufferedInput);
  if (bVar2) {
    sVar4 = read(0,(void *)((long)&start + 7),1);
    if ((sVar4 != 1) &&
       (iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                              ,0x422,"read(STDIN_FILENO, &ch, 1) == 1"), iVar3 != 0)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    pbVar5 = pbStack_20;
    if (start._7_1_ == '\x1b') {
      *pbStack_20 = '\x1b';
      uVar6 = readUnbufferedEscapedSequence(this,(char *)pbStack_20,(char *)(pbStack_20 + 1));
      this_local = (Private *)(uVar6 + 1);
    }
    else {
      *pbStack_20 = start._7_1_;
      pbVar7 = pbStack_20 + 1;
      uVar6 = Unicode::length(start._7_1_);
      this_local = (Private *)readUnbufferedUtf8Char(this,(char *)pbVar5,(char *)pbVar7,uVar6);
    }
  }
  else {
    pbVar5 = Buffer::operator_cast_to_unsigned_char_(&this->bufferedInput);
    *pbStack_20 = *pbVar5;
    Buffer::removeFront(&this->bufferedInput,1);
    pbVar5 = pbStack_20;
    if (*pbStack_20 == '\x1b') {
      uVar6 = readBufferedEscapedSequence(this,(char *)pbStack_20,(char *)(pbStack_20 + 1));
      this_local = (Private *)(uVar6 + 1);
    }
    else {
      ch_00 = *pbStack_20;
      pbStack_20 = pbStack_20 + 1;
      incompleteUtf8._capacity = Unicode::length(ch_00);
      for (; (ulong)((long)pbStack_20 - (long)pbVar5) < incompleteUtf8._capacity;
          pbStack_20 = pbStack_20 + 1) {
        bVar2 = Buffer::isEmpty(&this->bufferedInput);
        if (bVar2) {
          uVar6 = readUnbufferedUtf8Char
                            (this,(char *)pbVar5,(char *)pbStack_20,incompleteUtf8._capacity);
          return uVar6;
        }
        pbVar7 = Buffer::operator_cast_to_unsigned_char_(&this->bufferedInput);
        *pbStack_20 = *pbVar7;
        Buffer::removeFront(&this->bufferedInput,1);
        if (*pbStack_20 == '\x1b') {
          Buffer::Buffer((Buffer *)&result,pbVar5,(long)pbStack_20 - (long)pbVar5);
          *pbVar5 = '\x1b';
          uVar6 = readBufferedEscapedSequence(this,(char *)pbVar5,(char *)(pbVar5 + 1));
          Buffer::prepend(&this->bufferedInput,(Buffer *)&result);
          this_local = (Private *)(uVar6 + 1);
          Buffer::~Buffer((Buffer *)&result);
          return (usize)this_local;
        }
      }
      *pbStack_20 = '\0';
      this_local = (Private *)incompleteUtf8._capacity;
    }
  }
  return (usize)this_local;
}

Assistant:

usize readBufferedUtf8Char(char* buffer)
  {
    if(bufferedInput.isEmpty())
    {
      char ch;
      VERIFY(read(STDIN_FILENO, &ch, 1) == 1);
      if(ch == '\x1b')
      {
        *buffer = '\x1b';
        return 1 + readUnbufferedEscapedSequence(buffer, buffer + 1);
      }
      *buffer = ch;
      return readUnbufferedUtf8Char(buffer, buffer + 1, Unicode::length(ch));
    }
    *buffer = *(const char*)(const byte*)bufferedInput;
    bufferedInput.removeFront(1);
    if(*buffer == '\x1b')
      return 1 + readBufferedEscapedSequence(buffer, buffer + 1);
    char* start = buffer;
    usize len = Unicode::length(*(buffer++));
    while((usize)(buffer - start) < len)
    {
      if(bufferedInput.isEmpty())
        return readUnbufferedUtf8Char(start, buffer, len);
      *buffer = *(const char*)(const byte*)bufferedInput;
      bufferedInput.removeFront(1);
      if(*buffer == '\x1b')
      {
        Buffer incompleteUtf8((const byte*)start, buffer - start);
        *start = '\x1b';
        usize result = 1 + readBufferedEscapedSequence(start, start + 1);
        bufferedInput.prepend(incompleteUtf8);
        return result;
      }
      ++buffer;
    }
    *buffer = '\0';
    return len;
  }